

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-pile.c
# Opt level: O0

void drop_find_grid(player *p,chunk *c,object *drop,_Bool prefer_pile,loc_conflict *grid)

{
  loc_conflict grid1;
  bool bVar1;
  _Bool _Var2;
  int iVar3;
  wchar_t wVar4;
  uint32_t uVar5;
  uint32_t y;
  loc lVar6;
  loc_conflict grid_00;
  object *poVar7;
  wchar_t local_ac;
  wchar_t local_a8;
  wchar_t local_a4;
  wchar_t local_a0;
  wchar_t local_9c;
  wchar_t local_98;
  int local_94;
  int local_78;
  wchar_t score;
  wchar_t num_ignored;
  wchar_t num_shown;
  loc_conflict try;
  wchar_t dist;
  _Bool combine;
  object *obj;
  wchar_t dx;
  wchar_t dy;
  wchar_t i;
  loc_conflict best;
  loc_conflict start;
  wchar_t best_score;
  loc_conflict *grid_local;
  _Bool prefer_pile_local;
  object *drop_local;
  chunk *c_local;
  player *p_local;
  
  start.x = L'\xffffffff';
  grid1 = *grid;
  _dy = grid1;
  for (obj._4_4_ = -3; obj._4_4_ < 4; obj._4_4_ = obj._4_4_ + 1) {
    for (obj._0_4_ = -3; (int)obj < 4; obj._0_4_ = (int)obj + 1) {
      bVar1 = false;
      iVar3 = obj._4_4_ * obj._4_4_ + (int)obj * (int)obj;
      lVar6 = loc((int)obj,obj._4_4_);
      grid_00 = (loc_conflict)loc_sum((loc)grid1,lVar6);
      score = L'\0';
      local_78 = 0;
      if ((((iVar3 < 0xb) && (_Var2 = square_in_bounds_fully(c,grid_00), _Var2)) &&
          (_Var2 = los((chunk_conflict *)c,(loc)grid1,(loc)grid_00), _Var2)) &&
         ((_Var2 = square_isfloor(c,grid_00), _Var2 && (_Var2 = square_istrap(c,grid_00), !_Var2))))
      {
        for (_dist = square_object(c,grid_00); _dist != (object *)0x0; _dist = _dist->next) {
          _Var2 = object_mergeable(_dist,drop,OSTACK_FLOOR);
          if (_Var2) {
            bVar1 = true;
          }
          _Var2 = ignore_item_ok(p,_dist);
          if (_Var2) {
            local_78 = local_78 + 1;
          }
          else {
            score = score + L'\x01';
          }
        }
        if (!bVar1) {
          score = score + L'\x01';
        }
        if (((((p->opts).opt[0x23] & 1U) != 0) || (score < L'\x02')) &&
           ((score + local_78 <= (int)(uint)z_info->floor_size ||
            (poVar7 = floor_get_oldest_ignored(p,c,grid_00), poVar7 != (object *)0x0)))) {
          if (prefer_pile) {
            local_94 = 0;
          }
          else {
            local_94 = score * 5;
          }
          wVar4 = L'Ϩ' - (iVar3 + local_94);
          if ((start.x <= wVar4) && ((wVar4 != start.x || (uVar5 = Rand_div(2), uVar5 != 0)))) {
            _dy = grid_00;
            start.x = wVar4;
          }
        }
      }
    }
  }
  if (start.x < L'\0') {
    if (drop->artifact != (artifact *)0x0) {
      for (dx = L'\0'; dx < L'ߐ'; dx = dx + L'\x01') {
        if (dx < L'Ϩ') {
          lVar6 = rand_loc((loc)_dy,1,1);
          dy = lVar6.x;
          if (c->width + L'\xffffffff' < dy) {
            local_98 = c->width + L'\xffffffff';
          }
          else {
            local_98 = dy;
          }
          if (local_98 < L'\x01') {
            local_a0 = L'\0';
          }
          else {
            if (c->width + L'\xffffffff' < dy) {
              local_9c = c->width + L'\xffffffff';
            }
            else {
              local_9c = dy;
            }
            local_a0 = local_9c;
          }
          i = lVar6.y;
          if (c->height + L'\xffffffff' < i) {
            local_a4 = c->height + L'\xffffffff';
          }
          else {
            local_a4 = i;
          }
          if (local_a4 < L'\x01') {
            local_ac = L'\0';
          }
          else {
            if (c->height + L'\xffffffff' < i) {
              local_a8 = c->height + L'\xffffffff';
            }
            else {
              local_a8 = i;
            }
            local_ac = local_a8;
          }
          i = local_ac;
          dy = local_a0;
        }
        else {
          uVar5 = Rand_div(c->width);
          y = Rand_div(c->height);
          _dy = (loc_conflict)loc(uVar5,y);
        }
        _Var2 = square_canputitem(c,_dy);
        if (_Var2) {
          *grid = _dy;
          return;
        }
      }
    }
  }
  else {
    *grid = _dy;
  }
  return;
}

Assistant:

static void drop_find_grid(const struct player *p, struct chunk *c,
		struct object *drop, bool prefer_pile, struct loc *grid)
{
	int best_score = -1;
	struct loc start = *grid;
	struct loc best = start;
	int i, dy, dx;
	struct object *obj;

	/* Scan local grids */
	for (dy = -3; dy <= 3; dy++) {
		for (dx = -3; dx <= 3; dx++) {
			bool combine = false;
			int dist = (dy * dy) + (dx * dx);
			struct loc try = loc_sum(start, loc(dx, dy));
			int num_shown = 0;
			int num_ignored = 0;
			int score;

			/* Lots of reasons to say no */
			if ((dist > 10) ||
				!square_in_bounds_fully(c, try) ||
				!los(c, start, try) ||
				!square_isfloor(c, try) ||
				square_istrap(c, try))
				continue;

			/* Analyse the grid for carrying the new object */
			for (obj = square_object(c, try); obj; obj = obj->next){
				/* Check for possible combination */
				if (object_mergeable(obj, drop, OSTACK_FLOOR))
					combine = true;

				/* Count objects */
				if (!ignore_item_ok(p, obj))
					num_shown++;
				else
					num_ignored++;
			}
			if (!combine)
				num_shown++;

			/* Disallow if the stack size is too big */
			if ((!OPT(p, birth_stacking) && (num_shown > 1)) ||
				((num_shown + num_ignored) > z_info->floor_size &&
				 !floor_get_oldest_ignored(p, c, try)))
				continue;

			/* Score the location based on how close and how full the grid is */
			score = 1000 -
				(dist + (prefer_pile ? 0 : num_shown * 5));

			if ((score < best_score) || ((score == best_score) && one_in_(2)))
				continue;

			best_score = score;
			best = try;
		}
	}

	/* Return if we have a score, otherwise fail or try harder for artifacts */
	if (best_score >= 0) {
		*grid = best;
		return;
	} else if (!drop->artifact) {
		return;
	}
	for (i = 0; i < 2000; i++) {
		/* Start bouncing from grid to grid, stopping if we find an empty one */
		if (i < 1000) {
			best = rand_loc(best, 1, 1);
			/* Keep in bounds. */
			best.x = MAX(0, MIN(best.x, c->width - 1));
			best.y = MAX(0, MIN(best.y, c->height - 1));
		} else {
			/* Now go to purely random locations */
			best = loc(randint0(c->width), randint0(c->height));
		}
		if (square_canputitem(c, best)) {
			*grid = best;
			return;
		}
	}
}